

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::anon_unknown_0::GetRootPath
                   (string *__return_storage_ptr__,string *from_filename,string *to_filename)

{
  long lVar1;
  ulong local_60;
  size_t i;
  char *local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  ulong local_40;
  size_t slashes;
  allocator local_21;
  string *local_20;
  string *to_filename_local;
  string *from_filename_local;
  string *result;
  
  local_20 = to_filename;
  to_filename_local = from_filename;
  from_filename_local = __return_storage_ptr__;
  lVar1 = std::__cxx11::string::find((char *)to_filename,0x5d825d);
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"google-protobuf/",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    local_48._M_current = (char *)std::__cxx11::string::begin();
    local_50 = (char *)std::__cxx11::string::end();
    i._7_1_ = 0x2f;
    local_40 = std::count<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                         (local_48,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )local_50,(char *)((long)&i + 7));
    if (local_40 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"./",(allocator *)((long)&i + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
    }
    else {
      i._5_1_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)((long)&i + 4));
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 4));
      for (local_60 = 0; local_60 < local_40; local_60 = local_60 + 1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"../");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string GetRootPath(const string& from_filename, const string& to_filename) {
  if (to_filename.find("google/protobuf") == 0) {
    // Well-known types (.proto files in the google/protobuf directory) are
    // assumed to come from the 'google-protobuf' npm package.  We may want to
    // generalize this exception later by letting others put generated code in
    // their own npm packages.
    return "google-protobuf/";
  }

  size_t slashes = std::count(from_filename.begin(), from_filename.end(), '/');
  if (slashes == 0) {
    return "./";
  }
  string result = "";
  for (size_t i = 0; i < slashes; i++) {
    result += "../";
  }
  return result;
}